

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall Assimp::ASEImporter::ASEImporter(ASEImporter *this)

{
  ASEImporter *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00f3fe68;
  this->mParser = (Parser *)0x0;
  this->mBuffer = (char *)0x0;
  this->pcScene = (aiScene *)0x0;
  this->configRecomputeNormals = false;
  this->noSkeletonMesh = false;
  return;
}

Assistant:

ASEImporter::ASEImporter()
: mParser()
, mBuffer()
, pcScene()
, configRecomputeNormals()
, noSkeletonMesh() {
    // empty
}